

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O0

int xmlCurrentChar(xmlParserCtxtPtr ctxt,int *len)

{
  byte bVar1;
  byte *pbVar2;
  uint uVar3;
  uint local_34;
  int val;
  int c;
  size_t avail;
  uchar *cur;
  int *len_local;
  xmlParserCtxtPtr ctxt_local;
  
  if (((ctxt == (xmlParserCtxtPtr)0x0) || (len == (int *)0x0)) ||
     (ctxt->input == (xmlParserInputPtr)0x0)) {
    return 0;
  }
  _val = (long)ctxt->input->end - (long)ctxt->input->cur;
  if (_val < 0xfa) {
    xmlParserGrow(ctxt);
    _val = (long)ctxt->input->end - (long)ctxt->input->cur;
  }
  pbVar2 = ctxt->input->cur;
  local_34 = (uint)*pbVar2;
  if (local_34 < 0x80) {
    if (local_34 < 0x20) {
      if (local_34 == 0xd) {
        if (pbVar2[1] == 10) {
          ctxt->input->cur = ctxt->input->cur + 1;
        }
        *len = 1;
        local_34 = 10;
      }
      else if (local_34 == 0) {
        if (ctxt->input->cur < ctxt->input->end) {
          *len = 1;
          xmlFatalErr(ctxt,XML_ERR_INVALID_CHAR,"Char 0x0 out of allowed range\n");
        }
        else {
          *len = 0;
        }
      }
      else {
        *len = 1;
      }
    }
    else {
      *len = 1;
    }
    return local_34;
  }
  if (_val < 2) {
LAB_0015589f:
    *len = 0;
    ctxt_local._4_4_ = 0;
  }
  else {
    if ((pbVar2[1] & 0xc0) == 0x80) {
      if (local_34 < 0xe0) {
        if (0xc1 < local_34) {
          bVar1 = pbVar2[1];
          *len = 2;
          return bVar1 & 0x3f | (local_34 & 0x1f) << 6;
        }
      }
      else {
        if (_val < 3) goto LAB_0015589f;
        if ((pbVar2[2] & 0xc0) == 0x80) {
          if (local_34 < 0xf0) {
            uVar3 = pbVar2[2] & 0x3f | (pbVar2[1] & 0x3f) << 6 | (local_34 & 0xf) << 0xc;
            if ((0x7ff < uVar3) && ((uVar3 < 0xd800 || (0xdfff < uVar3)))) {
              *len = 3;
              return uVar3;
            }
          }
          else {
            if (_val < 4) goto LAB_0015589f;
            if ((((pbVar2[3] & 0xc0) == 0x80) &&
                (uVar3 = pbVar2[3] & 0x3f |
                         (pbVar2[2] & 0x3f) << 6 |
                         (pbVar2[1] & 0x3f) << 0xc | (local_34 & 0xf) << 0x12, 0xffff < uVar3)) &&
               (uVar3 < 0x110000)) {
              *len = 4;
              return uVar3;
            }
          }
        }
      }
    }
    if ((ctxt->input->flags & 0x20U) == 0) {
      xmlCtxtErrIO(ctxt,0x51,(char *)0x0);
      ctxt->input->flags = ctxt->input->flags | 0x20;
    }
    *len = 1;
    ctxt_local._4_4_ = 0x200000;
  }
  return ctxt_local._4_4_;
}

Assistant:

int
xmlCurrentChar(xmlParserCtxtPtr ctxt, int *len) {
    const unsigned char *cur;
    size_t avail;
    int c;

    if ((ctxt == NULL) || (len == NULL) || (ctxt->input == NULL)) return(0);

    avail = ctxt->input->end - ctxt->input->cur;

    if (avail < INPUT_CHUNK) {
        xmlParserGrow(ctxt);
        avail = ctxt->input->end - ctxt->input->cur;
    }

    cur = ctxt->input->cur;
    c = *cur;

    if (c < 0x80) {
	/* 1-byte code */
        if (c < 0x20) {
            /*
             *   2.11 End-of-Line Handling
             *   the literal two-character sequence "#xD#xA" or a standalone
             *   literal #xD, an XML processor must pass to the application
             *   the single character #xA.
             */
            if (c == '\r') {
                /*
                 * TODO: This function shouldn't change the 'cur' pointer
                 * as side effect, but the NEXTL macro in parser.c relies
                 * on this behavior when incrementing line numbers.
                 */
                if (cur[1] == '\n')
                    ctxt->input->cur++;
                *len = 1;
                c = '\n';
            } else if (c == 0) {
                if (ctxt->input->cur >= ctxt->input->end) {
                    *len = 0;
                } else {
                    *len = 1;
                    /*
                     * TODO: Null bytes should be handled by callers,
                     * but this can be tricky.
                     */
                    xmlFatalErr(ctxt, XML_ERR_INVALID_CHAR,
                            "Char 0x0 out of allowed range\n");
                }
            } else {
                *len = 1;
            }
        } else {
            *len = 1;
        }

        return(c);
    } else {
        int val;

        if (avail < 2)
            goto incomplete_sequence;
        if ((cur[1] & 0xc0) != 0x80)
            goto encoding_error;

        if (c < 0xe0) {
            /* 2-byte code */
            if (c < 0xc2)
                goto encoding_error;
            val = (c & 0x1f) << 6;
            val |= cur[1] & 0x3f;
            *len = 2;
        } else {
            if (avail < 3)
                goto incomplete_sequence;
            if ((cur[2] & 0xc0) != 0x80)
                goto encoding_error;

            if (c < 0xf0) {
                /* 3-byte code */
                val = (c & 0xf) << 12;
                val |= (cur[1] & 0x3f) << 6;
                val |= cur[2] & 0x3f;
                if ((val < 0x800) || ((val >= 0xd800) && (val < 0xe000)))
                    goto encoding_error;
                *len = 3;
            } else {
                if (avail < 4)
                    goto incomplete_sequence;
                if ((cur[3] & 0xc0) != 0x80)
                    goto encoding_error;

                /* 4-byte code */
                val = (c & 0x0f) << 18;
                val |= (cur[1] & 0x3f) << 12;
                val |= (cur[2] & 0x3f) << 6;
                val |= cur[3] & 0x3f;
                if ((val < 0x10000) || (val >= 0x110000))
                    goto encoding_error;
                *len = 4;
            }
        }

        return(val);
    }

encoding_error:
    /* Only report the first error */
    if ((ctxt->input->flags & XML_INPUT_ENCODING_ERROR) == 0) {
        xmlCtxtErrIO(ctxt, XML_ERR_INVALID_ENCODING, NULL);
        ctxt->input->flags |= XML_INPUT_ENCODING_ERROR;
    }
    *len = 1;
    return(XML_INVALID_CHAR);

incomplete_sequence:
    /*
     * An encoding problem may arise from a truncated input buffer
     * splitting a character in the middle. In that case do not raise
     * an error but return 0. This should only happen when push parsing
     * char data.
     */
    *len = 0;
    return(0);
}